

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O1

void __thiscall
program_options::required_option::required_option(required_option *this,string *option_name)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"the option \'%canonical_option%\' is required but missing","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  error_with_option_name::error_with_option_name
            (&this->super_error_with_option_name,&local_40,&local_60,option_name,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_error_with_option_name).super_error =
       &PTR__error_with_option_name_00171c68;
  return;
}

Assistant:

required_option(const std::string& option_name)
   : error_with_option_name("the option '%canonical_option%' is required but missing", "", option_name)
   {
   }